

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O2

Vector * Mul_QV(QMatrix *Q,Vector *V)

{
  double Dim;
  size_t *psVar1;
  ElType **ppEVar2;
  ElType **ppEVar3;
  Real *pRVar4;
  Real *pRVar5;
  double dVar6;
  LASErrIdType LVar7;
  Vector *V_00;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  double dVar14;
  ElType *pEVar15;
  Real *pRVar16;
  size_t sVar17;
  bool bVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  Real RVar30;
  
  Q_Lock(Q);
  V_Lock(V);
  LVar7 = LASResult();
  if (LVar7 == LASOK) {
    Dim = (double)Q->Dim;
    if (Dim == (double)V->Dim) {
      V_00 = (Vector *)malloc(0x30);
      pcVar8 = Q_GetName(Q);
      sVar9 = strlen(pcVar8);
      pcVar8 = V_GetName(V);
      sVar10 = strlen(pcVar8);
      pcVar8 = (char *)malloc(sVar9 + sVar10 + 10);
      pcVar11 = Q_GetName(Q);
      pcVar12 = V_GetName(V);
      if ((V_00 == (Vector *)0x0) || (pcVar8 == (char *)0x0)) {
        LASError(LASMemAllocErr,"Mul_QV",pcVar11,pcVar12,(char *)0x0);
        free(V_00);
      }
      else {
        sprintf(pcVar8,"(%s) * (%s)",pcVar11,pcVar12);
        V_Constr(V_00,pcVar8,(size_t)Dim,Tempor,True);
        Q_SortEl(Q);
        Q_AllocInvDiagEl(Q);
        LVar7 = LASResult();
        if ((LVar7 == LASOK) && (Q->ElSorted != (Boolean *)0x0)) {
          psVar1 = Q->Len;
          ppEVar2 = Q->El;
          ppEVar3 = Q->DiagEl;
          pRVar4 = V->Cmp;
          pRVar5 = V_00->Cmp;
          if ((Q->Symmetry != False) || (Q->ElOrder == Clmws)) {
            V_SetAllCmp(V_00,0.0);
          }
          dVar26 = V->Multipl;
          dVar20 = Q->MultiplD * dVar26;
          dVar22 = Q->MultiplU * dVar26;
          dVar26 = dVar26 * Q->MultiplL;
          dVar23 = ABS(dVar20);
          dVar21 = ABS(dVar20 + -1.0);
          if (((dVar23 < 2.2250738585072014e-307) ||
              (2.220446049250313e-15 <= ABS(dVar22 / dVar20 + -1.0))) ||
             (2.220446049250313e-15 <= ABS(dVar26 / dVar20 + -1.0))) {
            dVar24 = ABS(dVar22);
            dVar25 = ABS(dVar26);
            dVar27 = ABS(dVar22 + -1.0);
            dVar29 = ABS(dVar26 + -1.0);
            if (Q->Symmetry == False) {
              if (Q->ElOrder == Rowws) {
                for (dVar14 = 4.94065645841247e-324; (ulong)dVar14 <= (ulong)Dim;
                    dVar14 = (double)((long)dVar14 + 1)) {
                  sVar13 = psVar1[(long)dVar14];
                  RVar30 = 0.0;
                  if (2.2250738585072014e-307 <= dVar25) {
                    sVar17 = sVar13;
                    for (pEVar15 = ppEVar2[(long)dVar14];
                        (bVar18 = sVar17 != 0, sVar17 = sVar17 - 1, bVar18 &&
                        (pEVar15->Pos < (ulong)dVar14)); pEVar15 = pEVar15 + 1) {
                      RVar30 = RVar30 + pEVar15->Val * pRVar4[pEVar15->Pos];
                    }
                    if (2.220446049250313e-15 <= dVar29) {
                      RVar30 = RVar30 * dVar26;
                    }
                    RVar30 = RVar30 + 0.0;
                  }
                  if (2.2250738585072014e-307 <= dVar23) {
                    RVar30 = RVar30 + (double)(~-(ulong)(dVar21 < 2.220446049250313e-15) &
                                               (ulong)(dVar20 * ppEVar3[(long)dVar14]->Val) |
                                              (ulong)ppEVar3[(long)dVar14]->Val &
                                              -(ulong)(dVar21 < 2.220446049250313e-15)) *
                                      pRVar4[(long)dVar14];
                  }
                  if (2.2250738585072014e-307 <= dVar24) {
                    dVar28 = 0.0;
                    for (pRVar16 = &ppEVar2[(long)dVar14][sVar13 - 1].Val;
                        (bVar18 = sVar13 != 0, sVar13 = sVar13 - 1, bVar18 &&
                        ((ulong)dVar14 < ((ElType *)(pRVar16 + -1))->Pos)); pRVar16 = pRVar16 + -2)
                    {
                      dVar28 = dVar28 + *pRVar16 * pRVar4[((ElType *)(pRVar16 + -1))->Pos];
                    }
                    if (2.220446049250313e-15 <= dVar27) {
                      dVar28 = dVar28 * dVar22;
                    }
                    RVar30 = RVar30 + dVar28;
                  }
                  pRVar5[(long)dVar14] = RVar30;
                }
              }
              else if (Q->ElOrder == Clmws) {
                for (dVar26 = 4.94065645841247e-324; (ulong)dVar26 <= (ulong)Dim;
                    dVar26 = (double)((long)dVar26 + 1)) {
                  sVar13 = psVar1[(long)dVar26];
                  dVar29 = pRVar4[(long)dVar26];
                  if (2.2250738585072014e-307 <= dVar24) {
                    sVar17 = sVar13;
                    for (pEVar15 = ppEVar2[(long)dVar26];
                        (bVar18 = sVar17 != 0, sVar17 = sVar17 - 1, bVar18 &&
                        (dVar14 = (double)pEVar15->Pos, (ulong)dVar14 < (ulong)dVar26));
                        pEVar15 = pEVar15 + 1) {
                      pRVar5[(long)dVar14] =
                           pEVar15->Val *
                           (double)(~-(ulong)(dVar27 < 2.220446049250313e-15) &
                                    (ulong)(dVar22 * dVar29) |
                                   -(ulong)(dVar27 < 2.220446049250313e-15) & (ulong)dVar29) +
                           pRVar5[(long)dVar14];
                    }
                  }
                  if (2.2250738585072014e-307 <= dVar23) {
                    pRVar5[(long)dVar26] =
                         (double)(~-(ulong)(dVar21 < 2.220446049250313e-15) &
                                  (ulong)(dVar20 * ppEVar3[(long)dVar26]->Val) |
                                 (ulong)ppEVar3[(long)dVar26]->Val &
                                 -(ulong)(dVar21 < 2.220446049250313e-15)) * dVar29 +
                         pRVar5[(long)dVar26];
                  }
                  if (2.2250738585072014e-307 <= dVar25) {
                    for (pRVar16 = &ppEVar2[(long)dVar26][sVar13 - 1].Val;
                        (bVar18 = sVar13 != 0, sVar13 = sVar13 - 1, bVar18 &&
                        (dVar14 = (double)((ElType *)(pRVar16 + -1))->Pos,
                        (ulong)dVar26 < (ulong)dVar14)); pRVar16 = pRVar16 + -2) {
                      pRVar5[(long)dVar14] = *pRVar16 * dVar29 + pRVar5[(long)dVar14];
                    }
                  }
                }
              }
            }
            else {
              for (dVar14 = 4.94065645841247e-324; (ulong)dVar14 <= (ulong)Dim;
                  dVar14 = (double)((long)dVar14 + 1)) {
                sVar13 = psVar1[(long)dVar14];
                if (((2.2250738585072014e-307 <= dVar24) && (Q->ElOrder == Rowws)) ||
                   ((dVar28 = 0.0, 2.2250738585072014e-307 <= dVar25 && (Q->ElOrder == Clmws)))) {
                  pRVar16 = &ppEVar2[(long)dVar14]->Val;
                  dVar28 = 0.0;
                  sVar17 = sVar13;
                  while (bVar18 = sVar17 != 0, sVar17 = sVar17 - 1, bVar18) {
                    if ((double)((ElType *)(pRVar16 + -1))->Pos != dVar14) {
                      dVar28 = dVar28 + *pRVar16 * pRVar4[((ElType *)(pRVar16 + -1))->Pos];
                    }
                    pRVar16 = pRVar16 + 2;
                  }
                  if (2.220446049250313e-15 <= dVar27 && 2.2250738585072014e-307 <= dVar24) {
                    dVar28 = dVar28 * dVar22;
                  }
                  if (2.2250738585072014e-307 <= dVar25 && 2.220446049250313e-15 <= dVar29) {
                    dVar28 = dVar28 * dVar26;
                  }
                }
                if (2.2250738585072014e-307 <= dVar23) {
                  dVar28 = dVar28 + (double)(~-(ulong)(dVar21 < 2.220446049250313e-15) &
                                             (ulong)(dVar20 * ppEVar3[(long)dVar14]->Val) |
                                            (ulong)ppEVar3[(long)dVar14]->Val &
                                            -(ulong)(dVar21 < 2.220446049250313e-15)) *
                                    pRVar4[(long)dVar14];
                }
                pRVar5[(long)dVar14] = dVar28 + pRVar5[(long)dVar14];
                if (((2.2250738585072014e-307 <= dVar24) && (Q->ElOrder == Clmws)) ||
                   ((2.2250738585072014e-307 <= dVar25 && (Q->ElOrder == Rowws)))) {
                  dVar28 = pRVar4[(long)dVar14];
                  if (2.220446049250313e-15 <= dVar27 && 2.2250738585072014e-307 <= dVar24) {
                    dVar28 = dVar28 * dVar22;
                  }
                  if (2.2250738585072014e-307 <= dVar25 && 2.220446049250313e-15 <= dVar29) {
                    dVar28 = dVar28 * dVar26;
                  }
                  pRVar16 = &ppEVar2[(long)dVar14]->Val;
                  while (bVar18 = sVar13 != 0, sVar13 = sVar13 - 1, bVar18) {
                    dVar6 = (double)((ElType *)(pRVar16 + -1))->Pos;
                    if (dVar6 != dVar14) {
                      pRVar5[(long)dVar6] = *pRVar16 * dVar28 + pRVar5[(long)dVar6];
                    }
                    pRVar16 = pRVar16 + 2;
                  }
                }
              }
            }
          }
          else if (Q->Symmetry == False) {
            if (Q->ElOrder == Clmws) {
              for (dVar26 = 4.94065645841247e-324; (ulong)dVar26 <= (ulong)Dim;
                  dVar26 = (double)((long)dVar26 + 1)) {
                sVar13 = psVar1[(long)dVar26];
                dVar22 = pRVar4[(long)dVar26];
                pRVar16 = &ppEVar2[(long)dVar26]->Val;
                while (bVar18 = sVar13 != 0, sVar13 = sVar13 - 1, bVar18) {
                  pRVar5[((ElType *)(pRVar16 + -1))->Pos] =
                       *pRVar16 *
                       (double)(~-(ulong)(dVar21 < 2.220446049250313e-15) & (ulong)(dVar20 * dVar22)
                               | (ulong)dVar22 & -(ulong)(dVar21 < 2.220446049250313e-15)) +
                       pRVar5[((ElType *)(pRVar16 + -1))->Pos];
                  pRVar16 = pRVar16 + 2;
                }
              }
            }
            else if (Q->ElOrder == Rowws) {
              for (dVar26 = 4.94065645841247e-324; (ulong)dVar26 <= (ulong)Dim;
                  dVar26 = (double)((long)dVar26 + 1)) {
                sVar13 = psVar1[(long)dVar26];
                pRVar16 = &ppEVar2[(long)dVar26]->Val;
                dVar22 = 0.0;
                while (bVar18 = sVar13 != 0, sVar13 = sVar13 - 1, bVar18) {
                  dVar22 = dVar22 + *pRVar16 * pRVar4[((ElType *)(pRVar16 + -1))->Pos];
                  pRVar16 = pRVar16 + 2;
                }
                pRVar5[(long)dVar26] =
                     (Real)(~-(ulong)(dVar21 < 2.220446049250313e-15) & (ulong)(dVar20 * dVar22) |
                           (ulong)dVar22 & -(ulong)(dVar21 < 2.220446049250313e-15));
              }
            }
          }
          else {
            uVar19 = -(ulong)(dVar21 < 2.220446049250313e-15);
            for (dVar26 = 4.94065645841247e-324; (ulong)dVar26 <= (ulong)Dim;
                dVar26 = (double)((long)dVar26 + 1)) {
              sVar13 = psVar1[(long)dVar26];
              dVar21 = pRVar4[(long)dVar26];
              pRVar16 = &ppEVar2[(long)dVar26]->Val;
              dVar22 = 0.0;
              while (bVar18 = sVar13 != 0, sVar13 = sVar13 - 1, bVar18) {
                dVar23 = (double)((ElType *)(pRVar16 + -1))->Pos;
                if (dVar23 != dVar26) {
                  pRVar5[(long)dVar23] =
                       *pRVar16 *
                       (double)(~uVar19 & (ulong)(dVar20 * dVar21) | (ulong)dVar21 & uVar19) +
                       pRVar5[(long)dVar23];
                  dVar22 = dVar22 + *pRVar16 * pRVar4[(long)dVar23];
                }
                pRVar16 = pRVar16 + 2;
              }
              dVar22 = ppEVar3[(long)dVar26]->Val * pRVar4[(long)dVar26] + dVar22;
              pRVar5[(long)dVar26] =
                   (double)(~uVar19 & (ulong)(dVar20 * dVar22) | (ulong)dVar22 & uVar19) +
                   pRVar5[(long)dVar26];
            }
          }
        }
        else {
          LVar7 = LASResult();
          if ((LVar7 == LASOK) && (*Q->ElSorted == False)) {
            pcVar11 = Q_GetName(Q);
            pcVar12 = V_GetName(V);
            LASError(LASElNotSortedErr,"Mul_QV",pcVar11,pcVar12,(char *)0x0);
          }
        }
      }
      free(pcVar8);
    }
    else {
      pcVar8 = Q_GetName(Q);
      pcVar11 = V_GetName(V);
      V_00 = (Vector *)0x0;
      LASError(LASDimErr,"Mul_QV",pcVar8,pcVar11,(char *)0x0);
    }
  }
  else {
    V_00 = (Vector *)0x0;
  }
  Q_Unlock(Q);
  V_Unlock(V);
  return V_00;
}

Assistant:

Vector *Mul_QV(QMatrix *Q, Vector *V)
/* VRes = Q * V */
{
    Vector *VRes;

    char *VResName;
    double MultiplDV, MultiplUV, MultiplLV;
    double Sum, PartSum, Cmp, PartCmp;
    size_t Dim, Row, Clm, RoC, Len, ElCount;
    size_t *QLen;
    Boolean MultiplDVIsZero, MultiplUVIsZero, MultiplLVIsZero;
    Boolean MultiplDVIsOne, MultiplUVIsOne, MultiplLVIsOne;
    Boolean MultiplDULVEquals;
    ElType **QEl, **QDiagEl, *PtrEl;
    Real *VCmp, *VResCmp;

    Q_Lock(Q);
    V_Lock(V);
    
    if (LASResult() == LASOK) {
        if (Q->Dim == V->Dim) {
            Dim = V->Dim;
            VRes = (Vector *)malloc(sizeof(Vector));
            VResName = (char *)malloc((strlen(Q_GetName(Q)) + strlen(V_GetName(V)) + 10)
                           * sizeof(char));
            if (VRes != NULL && VResName != NULL) {
                sprintf(VResName, "(%s) * (%s)", Q_GetName(Q), V_GetName(V));
                V_Constr(VRes, VResName, Dim, Tempor, True);
                
                /* sort of elements and allocation of diagonal elements
                   of the matrix Q */
                Q_SortEl(Q);
                Q_AllocInvDiagEl(Q);

                if (LASResult() == LASOK && Q->ElSorted) {
                    /* assignment of auxiliary lokal variables */
                    QLen = Q->Len;
                    QEl = Q->El;
                    QDiagEl = Q->DiagEl;
                    VCmp = V->Cmp;
                    VResCmp = VRes->Cmp;

                    /* initialisation of the vector VRes */
                    if (Q->Symmetry || Q->ElOrder == Clmws)
                        V_SetAllCmp(VRes, 0.0);

                    /* analysis of multipliers of the lower, diagonal and upper part
                       of the matrix Q and of the vector V */
                    MultiplDV = Q->MultiplD * V->Multipl;
                    MultiplUV = Q->MultiplU * V->Multipl;
                    MultiplLV = Q->MultiplL * V->Multipl;
                    MultiplDVIsZero = IsZero(MultiplDV);
                    MultiplUVIsZero = IsZero(MultiplUV);
                    MultiplLVIsZero = IsZero(MultiplLV);
                    MultiplDVIsOne = IsOne(MultiplDV);
                    MultiplUVIsOne = IsOne(MultiplUV);
                    MultiplLVIsOne = IsOne(MultiplLV);
                    if (!IsZero(MultiplDV) && IsOne(MultiplUV / MultiplDV)
                        && IsOne(MultiplLV / MultiplDV)) {
                        MultiplDULVEquals = True;
                    } else {
                        MultiplDULVEquals = False;
                    }

                    /* multiplication of the lower, diagonal and upper part
                       of the matrix Q by the vector V */
                    if (Q->Symmetry) {
                        if (MultiplDULVEquals) {
                            for (RoC = 1; RoC <= Dim; RoC++) {
                                Len = QLen[RoC];
                                PtrEl = QEl[RoC];
                                   Sum = 0.0;
                                if (!MultiplDVIsOne)
                                    Cmp = MultiplDV * VCmp[RoC];
                                else
                                       Cmp = VCmp[RoC];
                                for (ElCount = Len; ElCount > 0; ElCount--) {
                                    if ((*PtrEl).Pos != RoC) {
                                        VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                        Sum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                    }
                                    PtrEl++;
                                }
                                Sum += (*QDiagEl[RoC]).Val * VCmp[RoC];
                                if (MultiplDVIsOne)
                                    VResCmp[RoC] += Sum;
                                else
                                    VResCmp[RoC] += MultiplDV * Sum;
                                  }
                        } else {
                            for (RoC = 1; RoC <= Dim; RoC++) {
                                Len = QLen[RoC];
                                   Sum = 0.0;
                                if ((!MultiplUVIsZero && Q->ElOrder == Rowws)
                                    || (!MultiplLVIsZero && Q->ElOrder == Clmws)) {
                                    PtrEl = QEl[RoC];
                                        for (ElCount = Len; ElCount > 0; ElCount--) {
                                        if ((*PtrEl).Pos != RoC) {
                                            Sum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                        }
                                        PtrEl++;
                                    }
                                    if (!MultiplUVIsZero && !MultiplUVIsOne)
                                           Sum = MultiplUV * Sum;
                                    if (!MultiplLVIsZero && !MultiplLVIsOne)
                                           Sum = MultiplLV * Sum;
                                }
                                if (!MultiplDVIsZero) {
                                    if (MultiplDVIsOne) {
                                        Sum += (*QDiagEl[RoC]).Val * VCmp[RoC];
                                    }
                                    else { // changed
                                        Sum += MultiplDV * (*QDiagEl[RoC]).Val * VCmp[RoC];
                                    }
                                }
                                VResCmp[RoC] += Sum;
                                if ((!MultiplUVIsZero && Q->ElOrder == Clmws)
                                    || (!MultiplLVIsZero && Q->ElOrder == Rowws)) {
                                      Cmp = VCmp[RoC];
                                    if (!MultiplUVIsZero && !MultiplUVIsOne)
                                         Cmp *= MultiplUV;
                                    if (!MultiplLVIsZero && !MultiplLVIsOne)
                                             Cmp *= MultiplLV;
                                    PtrEl = QEl[RoC];
                                        for (ElCount = Len; ElCount > 0; ElCount--) {
                                        if ((*PtrEl).Pos != RoC)
                                             VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                        PtrEl++;
                                    }
                                }
                              }
                        }
                    }
                    if (!Q->Symmetry && Q->ElOrder == Rowws) {
                        if (MultiplDULVEquals) {
                            for (Row = 1; Row <= Dim; Row++) {
                                Len = QLen[Row];
                                PtrEl = QEl[Row];
                                    Sum = 0.0;
                                for (ElCount = Len; ElCount > 0; ElCount--) {
                                    Sum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                    PtrEl++;
                                }
                                if (MultiplDVIsOne)
                                    VResCmp[Row] = Sum;
                                else
                                    VResCmp[Row] = MultiplDV * Sum;
                              }
                          } else {
                            for (Row = 1; Row <= Dim; Row++) {
                                Len = QLen[Row];
                                Sum = 0.0;
                                if (!MultiplLVIsZero) {
                                    PtrEl = QEl[Row];
                                        PartSum = 0.0;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos < Row;
                                        ElCount--) {
                                        PartSum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                        PtrEl++;
                                    }
                                    if (MultiplLVIsOne)
                                        Sum += PartSum;
                                    else
                                        Sum += MultiplLV * PartSum;
                                }
                                if (!MultiplDVIsZero) {
                                    if (MultiplDVIsOne)
                                        Sum += (*QDiagEl[Row]).Val * VCmp[Row];
                                    else
                                        Sum += MultiplDV * (*QDiagEl[Row]).Val * VCmp[Row];
                                }
                                if (!MultiplUVIsZero) {
                                    PtrEl = QEl[Row] + Len - 1;
                                        PartSum = 0.0;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos > Row;
                                        ElCount--) {
                                        PartSum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                        PtrEl--;
                                    }
                                    if (MultiplUVIsOne)
                                        Sum += PartSum;
                                    else
                                        Sum += MultiplUV * PartSum;
                                }
                                VResCmp[Row] = Sum;
                              }
                        }
                    }
                    if (!Q->Symmetry && Q->ElOrder == Clmws) {
                        if (MultiplDULVEquals) {
                             for (Clm = 1; Clm <= Dim; Clm++) {
                                Len = QLen[Clm];
                                PtrEl = QEl[Clm];
                                if (MultiplDVIsOne)
                                       Cmp = VCmp[Clm];
                                else
                                    Cmp = MultiplDV * VCmp[Clm];
                                for (ElCount = Len; ElCount > 0; ElCount--) {
                                    VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                    PtrEl++;
                                }
                            }
                          } else {
                            for (Clm = 1; Clm <= Dim; Clm++) {
                                Len = QLen[Clm];
                                Cmp = VCmp[Clm];
                                if (!MultiplUVIsZero) {
                                    PtrEl = QEl[Clm];
                                    if (MultiplUVIsOne)
                                        PartCmp = Cmp;
                                    else
                                        PartCmp = MultiplUV * Cmp;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos < Clm;
                                        ElCount--) {
                                         VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * PartCmp;
                                        PtrEl++;
                                    }
                                }
                                if (!MultiplDVIsZero) {
                                    if (MultiplDVIsOne)
                                         VResCmp[Clm] += (*QDiagEl[Clm]).Val * Cmp;
                                    else
                                         VResCmp[Clm] += MultiplDV * (*QDiagEl[Clm]).Val * Cmp;
                                }
                                if (!MultiplLVIsZero) {
                                    PtrEl = QEl[Clm] + Len - 1;
                                    if (MultiplLVIsOne)
                                        PartCmp = Cmp;
                                    else
                                        PartCmp = MultiplLV * Cmp;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos > Clm;
                                        ElCount--) {
                                         VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                        PtrEl--;
                                    }
                                }
                              }
                        }
                    }
                } else {
                    if (LASResult() == LASOK && !(*Q->ElSorted))
                        LASError(LASElNotSortedErr, "Mul_QV", Q_GetName(Q), V_GetName(V), NULL);
                }
            } else {
                LASError(LASMemAllocErr, "Mul_QV", Q_GetName(Q), V_GetName(V), NULL);
                if (VRes != NULL)
                    free(VRes);
            }
            
            if (VResName != NULL)
                free(VResName);
        } else {
            LASError(LASDimErr, "Mul_QV", Q_GetName(Q), V_GetName(V), NULL);
            VRes = NULL;
        }
    } else {
        VRes = NULL;
    }

    Q_Unlock(Q);
    V_Unlock(V);

    return(VRes);
}